

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<SequenceDistanceGraphPath&,std::vector<long,std::allocator<long>>const&>::
load_impl_sequence<0ul,1ul>(void *param_1,long param_2)

{
  handle src;
  reference pvVar1;
  const_iterator pbVar2;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  bool bStack000000000000004f;
  undefined8 in_stack_00000048;
  list_caster<std::vector<long,_std::allocator<long>_>,_long> *in_stack_00000050;
  handle in_stack_00000058;
  initializer_list<bool> *__range3;
  type_caster_generic *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  size_type in_stack_ffffffffffffff88;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  bStack000000000000004f = SUB81((ulong)in_stack_00000048 >> 0x38,0);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<SequenceDistanceGraphPath,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>>
            ((tuple<pybind11::detail::type_caster<SequenceDistanceGraphPath,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>_>
              *)0x3fe159);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  src.m_ptr._7_1_ = in_stack_ffffffffffffff87;
  src.m_ptr._0_7_ = in_stack_ffffffffffffff80;
  local_32 = type_caster_generic::load
                       (in_stack_ffffffffffffff78,src,SUB81((ulong)param_1 >> 0x38,0));
  std::
  get<1ul,pybind11::detail::type_caster<SequenceDistanceGraphPath,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>>
            ((tuple<pybind11::detail::type_caster<SequenceDistanceGraphPath,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>_>
              *)0x3fe1c7);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_31 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                       (in_stack_00000050,in_stack_00000058,bStack000000000000004f);
  local_30._M_array = &local_32;
  local_30._M_len = 2;
  local_20 = &local_30;
  pbVar2 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end((initializer_list<bool> *)param_1);
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }